

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O2

void __thiscall
MeCab::Tokenizer<mecab_learner_node_t,_mecab_learner_path_t>::Tokenizer
          (Tokenizer<mecab_learner_node_t,_mecab_learner_path_t> *this)

{
  this->_vptr_Tokenizer = (_func_int **)&PTR__Tokenizer_00139bd8;
  (this->dic_).super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dic_).super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dic_).super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Dictionary::Dictionary(&this->unkdic_);
  scoped_string::scoped_string(&this->bos_feature_);
  scoped_string::scoped_string(&this->unk_feature_);
  (this->dictionary_info_freelist_)._vptr_FreeList = (_func_int **)&PTR__FreeList_00139c48;
  (this->dictionary_info_freelist_).freeList.
  super__Vector_base<mecab_dictionary_info_t_*,_std::allocator<mecab_dictionary_info_t_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dictionary_info_freelist_).freeList.
  super__Vector_base<mecab_dictionary_info_t_*,_std::allocator<mecab_dictionary_info_t_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dictionary_info_freelist_).li_ = 0;
  (this->dictionary_info_freelist_).freeList.
  super__Vector_base<mecab_dictionary_info_t_*,_std::allocator<mecab_dictionary_info_t_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->dictionary_info_freelist_).pi_ = 0;
  (this->dictionary_info_freelist_).size = 4;
  (this->unk_tokens_).
  super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->unk_tokens_).
  super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->unk_tokens_).
  super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->dictionary_info_ = (DictionaryInfo *)0x0;
  this->space_ = (CharInfo)0x0;
  CharProperty::CharProperty(&this->property_);
  this->max_grouping_size_ = 0;
  whatlog::whatlog(&this->what_);
  return;
}

Assistant:

Tokenizer<N, P>::Tokenizer()
    : dictionary_info_freelist_(4),
      dictionary_info_(0),
      max_grouping_size_(0) {}